

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractStringValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractStringValidator::normalizeEnumeration
          (AbstractStringValidator *this,MemoryManager *manager)

{
  DatatypeValidator *pDVar1;
  RefArrayVectorOf<char16_t> *pRVar2;
  XMLSize_t XVar3;
  char16_t *pcVar4;
  XMLSize_t i;
  XMLSize_t XVar5;
  
  pDVar1 = (this->super_DatatypeValidator).fBaseValidator;
  pRVar2 = this->fEnumeration;
  if ((pDVar1 != (DatatypeValidator *)0x0 && pRVar2 != (RefArrayVectorOf<char16_t> *)0x0) &&
     ((pDVar1->fFacetsDefined & 0x4000) != 0)) {
    if (pDVar1->fWhiteSpace == 2) {
      XVar3 = (pRVar2->super_BaseRefVectorOf<char16_t>).fCurCount;
      for (XVar5 = 0; XVar3 != XVar5; XVar5 = XVar5 + 1) {
        pcVar4 = BaseRefVectorOf<char16_t>::elementAt
                           (&this->fEnumeration->super_BaseRefVectorOf<char16_t>,XVar5);
        XMLString::collapseWS(pcVar4,manager);
      }
    }
    else if (pDVar1->fWhiteSpace == 1) {
      XVar3 = (pRVar2->super_BaseRefVectorOf<char16_t>).fCurCount;
      for (XVar5 = 0; XVar3 != XVar5; XVar5 = XVar5 + 1) {
        pcVar4 = BaseRefVectorOf<char16_t>::elementAt
                           (&this->fEnumeration->super_BaseRefVectorOf<char16_t>,XVar5);
        XMLString::replaceWS(pcVar4,manager);
      }
    }
  }
  return;
}

Assistant:

void AbstractStringValidator::normalizeEnumeration(MemoryManager* const manager)
{
    AbstractStringValidator *pBaseValidator = (AbstractStringValidator*) getBaseValidator();

    if (!fEnumeration || !pBaseValidator)
        return;

    int baseFacetsDefined = pBaseValidator->getFacetsDefined();
    if ((baseFacetsDefined & DatatypeValidator::FACET_WHITESPACE) == 0)
        return;

    short whiteSpace = pBaseValidator->getWSFacet();

    if ( whiteSpace == DatatypeValidator::PRESERVE )
    {
        return;
    }
    else if ( whiteSpace == DatatypeValidator::REPLACE )
    {
        XMLSize_t enumLength = getEnumeration()->size();
        for ( XMLSize_t i=0; i < enumLength; i++)
        {
            XMLString::replaceWS(getEnumeration()->elementAt(i), manager);
        }
    }
    else if ( whiteSpace == DatatypeValidator::COLLAPSE )
    {
        XMLSize_t enumLength = getEnumeration()->size();
        for ( XMLSize_t i=0; i < enumLength; i++)
        {
            XMLString::collapseWS(getEnumeration()->elementAt(i), manager);
        }
    }
}